

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipcommunication.c
# Opt level: O2

int ipcmd_send_tcp(ipcmd_t *ipcmd,YPSpur_msg *data)

{
  int *piVar1;
  ssize_t sVar2;
  int iVar3;
  
  iVar3 = -1;
  if ((ipcmd != (ipcmd_t *)0x0) && (ipcmd->connection_error == 0)) {
    if (ipcmd->tcp_type == IPCMD_TCP_CLIENT) {
      piVar1 = &ipcmd->socket;
    }
    else {
      piVar1 = ipcmd->clients + (int)data->msg_type;
    }
    sVar2 = send(*piVar1,data,0x38,0);
    if (sVar2 < 0) {
      if (ipcmd->tcp_type == IPCMD_TCP_CLIENT) {
        shutdown(ipcmd->socket,2);
        ipcmd->connection_error = 1;
      }
    }
    else {
      iVar3 = 0x38;
    }
  }
  return iVar3;
}

Assistant:

int ipcmd_send_tcp(struct ipcmd_t* ipcmd, YPSpur_msg* data)
{
  int sock;
  size_t len = sizeof(YPSpur_msg);

  if (ipcmd == NULL || ipcmd->connection_error)
    return -1;

  if (ipcmd->tcp_type == IPCMD_TCP_CLIENT)
  {
    sock = ipcmd->socket;
  }
  else
  {
    sock = ipcmd->clients[(int)data->msg_type];
  }
  if (send(sock, (SOCK_DATATYPE)data, len, 0) < 0)
  {
    if (ipcmd->tcp_type == IPCMD_TCP_CLIENT)
    {
      shutdown(ipcmd->socket, SOCK_SHUTDOWN_OPTION);
      ipcmd->connection_error = 1;
    }
    return -1;
  }

  return len;
}